

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

Util * __thiscall
Util::writeXmlAttribute<bool>(Util *this,stringstream *str,string *attr,bool value)

{
  ostream *poVar1;
  bool value_local;
  string *attr_local;
  stringstream *str_local;
  
  poVar1 = std::operator<<((ostream *)(str + 0x10)," ");
  poVar1 = std::operator<<(poVar1,(string *)attr);
  poVar1 = std::operator<<(poVar1,"=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value);
  std::operator<<(poVar1,"\"");
  std::__cxx11::stringstream::str();
  return this;
}

Assistant:

static std::string writeXmlAttribute(std::stringstream &str, std::string attr, T value)
	{
		str << " " << attr << "=\"" << value << "\"";
		return str.str();
	}